

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O1

void __thiscall EventDispatcher::sendEventSync(EventDispatcher *this,Event *ev)

{
  Mutex *this_00;
  int iVar1;
  SyncEventHolder holder;
  SyncEventHolder local_38;
  
  SyncEventHolder::SyncEventHolder(&local_38,ev);
  EventQueue::SendEvent(&this->mQueue,&local_38.super_Event);
  (*(this->super_IEventDispatcher)._vptr_IEventDispatcher[0xc])(this);
  iVar1 = (*(this->super_IEventDispatcher)._vptr_IEventDispatcher[7])(this);
  if ((char)iVar1 != '\0') {
    jh_log_print(1,"virtual void EventDispatcher::sendEventSync(Event *)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                 ,0xa3,"Sending sync event to your current thread, I will die now...");
  }
  this_00 = &this->mSyncLock;
  Mutex::Lock(this_00);
  while (local_38.mDone == false) {
    Condition::Wait(&this->mSyncWait,this_00);
  }
  Mutex::Unlock(this_00);
  local_38.super_Event.super_RefCount._vptr_RefCount = (_func_int **)&PTR_onRefCountZero_0012fe40;
  SmartPtr<Event>::~SmartPtr(&local_38.mRealEvent);
  return;
}

Assistant:

void EventDispatcher::sendEventSync( Event *ev )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	// event ref count handled by holder.
	SyncEventHolder holder( ev );

	mQueue.SendEvent( &holder );
	wakeThread();
	
	if (isThreadCurrent())
		LOG_ERR_FATAL("Sending sync event to your current thread, I will die now...");
	
	mSyncLock.Lock();
	while ( holder.mDone == false )
		mSyncWait.Wait( mSyncLock );
	mSyncLock.Unlock();
}